

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O3

int bbuf_clone(BBuf **rto,BBuf *from)

{
  BBuf *bbuf;
  OnigUChar *__dest;
  int iVar1;
  uint uVar2;
  
  bbuf = (BBuf *)malloc(0x10);
  *rto = bbuf;
  iVar1 = -5;
  if (bbuf != (BBuf *)0x0) {
    uVar2 = from->alloc;
    if ((long)(int)uVar2 < 1) {
      bbuf->p = (OnigUChar *)0x0;
      __dest = (OnigUChar *)0x0;
      uVar2 = 0;
    }
    else {
      __dest = (OnigUChar *)malloc((long)(int)uVar2);
      bbuf->p = __dest;
      if (__dest == (OnigUChar *)0x0) {
        bbuf_free(bbuf);
        *rto = (BBuf *)0x0;
        return -5;
      }
    }
    bbuf->alloc = uVar2;
    uVar2 = from->used;
    bbuf->used = uVar2;
    memcpy(__dest,from->p,(ulong)uVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
bbuf_clone(BBuf** rto, BBuf* from)
{
  int r;
  BBuf *to;

  *rto = to = (BBuf* )xmalloc(sizeof(BBuf));
  CHECK_NULL_RETURN_MEMERR(to);
  r = BB_INIT(to, from->alloc);
  if (r != 0) {
    bbuf_free(to);
    *rto = 0;
    return r;
  }
  to->used = from->used;
  xmemcpy(to->p, from->p, from->used);
  return 0;
}